

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lru_cache.hpp
# Opt level: O3

void __thiscall
cappuccino::
lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
::do_erase(lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
           *this,size_t element_idx)

{
  long lVar1;
  long lVar2;
  uint in_EAX;
  long lVar3;
  __off64_t *in_R8;
  size_t in_R9;
  
  lVar1 = *(long *)(this + 0x30);
  lVar3 = *(long *)(*(long *)(this + 0x98) + 8);
  lVar2 = *(long *)(lVar1 + 8 + element_idx * 0x30);
  if (lVar2 != lVar3) {
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::splice
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x80),
               (int)*(long *)(this + 0x98),(__off64_t *)(this + 0x80),(int)lVar2,in_R8,in_R9,in_EAX)
    ;
    lVar3 = *(long *)(*(long *)(this + 0x98) + 8);
  }
  *(long *)(this + 0x98) = lVar3;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::erase((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)(this + 0x48),
          (const_iterator)
          ((_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> *)
          (lVar1 + element_idx * 0x30))->_M_cur);
  *(long *)(this + 0x28) = *(long *)(this + 0x28) + -1;
  return;
}

Assistant:

auto do_erase(size_t element_idx) -> void
    {
        element& e = m_elements[element_idx];

        if (e.m_lru_position != std::prev(m_lru_end))
        {
            m_lru_list.splice(m_lru_end, m_lru_list, e.m_lru_position);
        }
        --m_lru_end;

        m_keyed_elements.erase(e.m_keyed_position);

        --m_used_size;
    }